

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O2

void __thiscall
Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints
          (ComponentMap *this,Solver *generator,SccGraph *dep,uint32 scc,SharedContext *comp)

{
  uint uVar1;
  NodeId nodeId;
  ClauseCreator *pCVar2;
  MapIt_c pMVar3;
  uint *puVar4;
  uint *puVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer pBVar8;
  NodeId *pNVar9;
  NodeId *other;
  uint *puVar10;
  Literal local_b0;
  uint local_ac;
  iterator local_a8;
  SccGraph *local_a0;
  pointer local_98;
  Solver *local_90;
  pointer local_88;
  pointer local_80;
  uint *local_78;
  ClauseCreator cc;
  ClauseCreator dc;
  
  local_ac = scc;
  local_a0 = dep;
  ClauseCreator::ClauseCreator(&cc,*(comp->solvers_).ebo_.buf);
  cc.flags_._1_1_ = cc.flags_._1_1_ | 1;
  ClauseCreator::ClauseCreator(&dc,*(comp->solvers_).ebo_.buf);
  pMVar7 = (this->mapping).ebo_.buf;
  pMVar6 = pMVar7 + this->numAtoms;
  pMVar7 = pMVar7 + (this->mapping).ebo_.size;
  local_a8 = pMVar6;
  local_98 = pMVar7;
  local_90 = generator;
  do {
    if (pMVar6 == pMVar7) {
      bk_lib::
      pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
      ::erase(&this->mapping,local_a8,(this->mapping).ebo_.buf + (this->mapping).ebo_.size);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo
                (&dc.literals_.ebo_);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo
                (&cc.literals_.ebo_);
      return;
    }
    pBVar8 = (local_a0->bodies_).ebo_.buf;
    uVar1 = pBVar8[pMVar6->node].super_Node.lit.rep_;
    if ((byte)(*(byte *)((long)(generator->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc))
              & 3) != (byte)(((uVar1 & 2) == 0) + 1U)) {
      pBVar8 = pBVar8 + pMVar6->node;
      local_88 = pMVar6;
      if (((pBVar8->super_Node).field_0x7 & 0x10) != 0) {
        Potassco::fail(-2,
                       "void Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver &, const SccGraph &, uint32, SharedContext &)"
                       ,0x201,"!B.extended()",
                       "Extended bodies not supported - use \'--trans-ext=weight\'",0);
      }
      local_78 = (pBVar8->super_Node).sep_;
      local_80 = pBVar8;
      for (puVar4 = (pBVar8->super_Node).adj_; puVar4 != local_78; puVar4 = puVar4 + 1) {
        if ((ulong)*puVar4 == 0) {
          if ((*(uint *)&(local_a0->atoms_).ebo_.buf[puVar4[1]].super_Node.field_0x4 & 0xfffffff) ==
              local_ac) goto LAB_0012f448;
          do {
            puVar5 = puVar4 + 1;
            puVar10 = puVar4 + 1;
            puVar4 = puVar5;
          } while (*puVar10 != 0);
        }
        else if ((*(uint *)&(local_a0->atoms_).ebo_.buf[*puVar4].super_Node.field_0x4 & 0xfffffff)
                 == local_ac) {
LAB_0012f448:
          pCVar2 = ClauseCreator::start(&cc,Static);
          local_b0.rep_ =
               (*(uint *)&local_88->field_0x4 >> 0x1d & 2) + *(uint *)&local_88->field_0x4 * 4;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&pCVar2->literals_,&local_b0);
          if ((*(uint *)&(local_80->super_Node).field_0x4 & 0xfffffff) == local_ac) {
            for (pNVar9 = (local_80->super_Node).sep_; *pNVar9 != 0xffffffff; pNVar9 = pNVar9 + 1) {
              pMVar3 = findAtom(this,*pNVar9);
              local_b0.rep_ = *(int *)&pMVar3->field_0x4 << 2;
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                        (&cc.literals_,&local_b0);
            }
          }
          if (*puVar4 == 0) {
            puVar5 = puVar4 + 1;
            for (puVar4 = puVar5; *puVar4 != 0; puVar4 = puVar4 + 1) {
              ClauseCreator::start(&dc,Static);
              ClauseCreator::operator=(&dc,&cc);
              pMVar3 = findAtom(this,*puVar4);
              local_b0.rep_ = *(int *)&pMVar3->field_0x4 * 4 + 2;
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                        (&dc.literals_,&local_b0);
              for (puVar10 = puVar5; nodeId = *puVar10, nodeId != 0; puVar10 = puVar10 + 1) {
                if (nodeId != *puVar4) {
                  pMVar3 = findAtom(this,nodeId);
                  local_b0.rep_ = *(int *)&pMVar3->field_0x4 * 4 + 4;
                  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                            (&dc.literals_,&local_b0);
                }
              }
              ClauseCreator::end(&dc,0x14);
            }
          }
          else {
            pMVar3 = findAtom(this,*puVar4);
            local_b0.rep_ = *(int *)&pMVar3->field_0x4 * 4 + 2;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (&cc.literals_,&local_b0);
            ClauseCreator::end(&cc,0x14);
          }
        }
      }
      pMVar6 = local_88;
      pMVar7 = local_98;
      generator = local_90;
      if (*(uint *)&local_88->field_0x4 < 0x40000000) {
        *local_a8 = *local_88;
        local_a8 = local_a8 + 1;
      }
    }
    pMVar6 = pMVar6 + 1;
  } while( true );
}

Assistant:

void PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver& generator, const SccGraph& dep, uint32 scc, SharedContext& comp) {
	ClauseCreator cc(comp.master());
	cc.addDefaultFlags(ClauseCreator::clause_force_simplify);
	ClauseCreator dc(comp.master());
	MapIt j = mapping.begin() + numAtoms;
	for (MapRange r = bodies(); r.first != r.second; ++r.first) {
		const BodyNode& B = dep.getBody(r.first->node);
		if (generator.isFalse(B.lit)) { continue; }
		POTASSCO_REQUIRE(!B.extended(), "Extended bodies not supported - use '--trans-ext=weight'");
		for (const NodeId* hIt = B.heads_begin(), *hEnd = B.heads_end(); hIt != hEnd; ++hIt) {
			uint32 hScc = *hIt ? dep.getAtom(*hIt).scc : dep.getAtom(hIt[1]).scc;
			if (hScc != scc) {
				// the head is not relevant to this non-hcf - skip it
				if (!*hIt) { do { ++hIt; } while (*hIt); }
				continue;
			}
			// [fb(B) v ~up(a) V hp(o) for all o != a in B.disHead V up(b) for each b in B+ ^ C]
			cc.start().add(r.first->fb());
			if (B.scc == scc) { // add subgoals from same scc
				for (const NodeId* aIt = B.preds(); *aIt != idMax; ++aIt) {
					MapIt_c atMapped = findAtom(*aIt);
					cc.add(atMapped->up());
				}
			}
			if (*hIt) { // normal head
				MapIt_c atMapped = findAtom(*hIt);
				assert(atMapped != atoms().second);
				cc.add(~atMapped->up());
				cc.end();
			}
			else { // disjunctive head
				const NodeId* dHead = ++hIt;
				for (; *hIt; ++hIt) {
					dc.start();
					dc = cc;
					MapIt_c atMapped = findAtom(*hIt);
					dc.add(~atMapped->up());
					for (const NodeId* other = dHead; *other; ++other) {
						if (*other != *hIt) {
							assert(dep.getAtom(*other).scc == scc);
							atMapped = findAtom(*other);
							dc.add(atMapped->hp());
						}
					}
					dc.end();
				}
			}
		}
		if (!r.first->eq()) { *j++ = *r.first; }
	}
	mapping.erase(j, mapping.end());
}